

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::EncryptionAlgorithm::__set_AES_GCM_V1(EncryptionAlgorithm *this,AesGcmV1 *val)

{
  AesGcmV1::operator=(&this->AES_GCM_V1,val);
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset | 1);
  return;
}

Assistant:

void EncryptionAlgorithm::__set_AES_GCM_V1(const AesGcmV1& val) {
  this->AES_GCM_V1 = val;
__isset.AES_GCM_V1 = true;
}